

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_striped_avx2_256_32.c
# Opt level: O3

parasail_result_t *
parasail_sw_stats_table_striped_profile_avx2_256_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  long lVar1;
  long lVar2;
  __m256i alVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined4 uVar6;
  void *pvVar7;
  parasail_matrix_t *ppVar8;
  void *pvVar9;
  void *pvVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  uint uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  __m256i c;
  __m256i c_00;
  __m256i c_01;
  __m256i c_02;
  __m256i c_03;
  __m256i c_04;
  __m256i c_05;
  int iVar19;
  parasail_result_t *result;
  __m256i *palVar20;
  __m256i *palVar21;
  __m256i *b;
  __m256i *palVar22;
  __m256i *b_00;
  __m256i *b_01;
  __m256i *b_02;
  __m256i *b_03;
  __m256i *b_04;
  long lVar23;
  int iVar24;
  int iVar25;
  __m256i *palVar26;
  long lVar27;
  __m256i *palVar28;
  long lVar29;
  __m256i *palVar30;
  ulong uVar31;
  uint uVar32;
  long lVar33;
  long lVar34;
  ulong uVar35;
  __m256i *palVar36;
  ulong size;
  ulong uVar37;
  long lVar38;
  __m256i *palVar39;
  uint uVar40;
  long lVar41;
  bool bVar42;
  undefined1 auVar43 [16];
  undefined1 auVar46 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar47 [16];
  undefined1 auVar52 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [64];
  undefined1 auVar53 [16];
  undefined1 auVar55 [16];
  undefined1 auVar54 [32];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [64];
  undefined1 auVar68 [32];
  undefined1 auVar69 [64];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  int32_t column_len;
  undefined1 in_stack_fffffffffffffda8 [12];
  undefined4 in_stack_fffffffffffffdb4;
  int iVar75;
  __m256i *local_230;
  __m256i *local_228;
  __m256i *local_220;
  __m256i *local_218;
  ulong local_210;
  __m256i *local_208;
  __m256i *local_200;
  __m256i *local_1f8;
  __m256i *local_1f0;
  ulong local_1d0;
  int local_198;
  undefined1 local_178 [32];
  undefined4 local_158;
  undefined4 uStack_154;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sw_stats_table_striped_profile_avx2_256_32_cold_8();
  }
  else {
    pvVar7 = (profile->profile32).score;
    if (pvVar7 == (void *)0x0) {
      parasail_sw_stats_table_striped_profile_avx2_256_32_cold_7();
    }
    else {
      ppVar8 = profile->matrix;
      if (ppVar8 == (parasail_matrix_t *)0x0) {
        parasail_sw_stats_table_striped_profile_avx2_256_32_cold_6();
      }
      else {
        uVar32 = profile->s1Len;
        uVar37 = (ulong)uVar32;
        if ((int)uVar32 < 1) {
          parasail_sw_stats_table_striped_profile_avx2_256_32_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_stats_table_striped_profile_avx2_256_32_cold_4();
        }
        else {
          local_1d0 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_sw_stats_table_striped_profile_avx2_256_32_cold_3();
          }
          else if (open < 0) {
            parasail_sw_stats_table_striped_profile_avx2_256_32_cold_2();
          }
          else if (gap < 0) {
            parasail_sw_stats_table_striped_profile_avx2_256_32_cold_1();
          }
          else {
            uVar31 = uVar37 + 7;
            pvVar9 = (profile->profile32).matches;
            pvVar10 = (profile->profile32).similar;
            iVar24 = ppVar8->max;
            result = parasail_result_new_table3((uint)uVar31 & 0x7ffffff8,s2Len);
            if (result != (parasail_result_t *)0x0) {
              size = uVar31 >> 3;
              result->flag = result->flag | 0x8430804;
              palVar20 = parasail_memalign___m256i(0x20,size);
              local_230 = parasail_memalign___m256i(0x20,size);
              palVar21 = parasail_memalign___m256i(0x20,size);
              local_220 = parasail_memalign___m256i(0x20,size);
              b = parasail_memalign___m256i(0x20,size);
              palVar22 = parasail_memalign___m256i(0x20,size);
              b_00 = parasail_memalign___m256i(0x20,size);
              local_218 = parasail_memalign___m256i(0x20,size);
              b_01 = parasail_memalign___m256i(0x20,size);
              b_02 = parasail_memalign___m256i(0x20,size);
              b_03 = parasail_memalign___m256i(0x20,size);
              b_04 = parasail_memalign___m256i(0x20,size);
              local_200 = parasail_memalign___m256i(0x20,size);
              local_1f0 = parasail_memalign___m256i(0x20,size);
              local_208 = parasail_memalign___m256i(0x20,size);
              local_1f8 = parasail_memalign___m256i(0x20,size);
              auVar60._8_8_ = 0;
              auVar60._0_8_ = palVar20;
              auVar61._8_8_ = 0;
              auVar61._0_8_ = local_230;
              auVar60 = vpunpcklqdq_avx(auVar60,auVar61);
              auVar43._8_8_ = 0;
              auVar43._0_8_ = palVar21;
              auVar46._8_8_ = 0;
              auVar46._0_8_ = local_220;
              auVar61 = vpunpcklqdq_avx(auVar43,auVar46);
              auVar43 = ZEXT116(0) * auVar61 + ZEXT116(1) * auVar60;
              auVar46 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar61;
              auVar47._8_8_ = 0;
              auVar47._0_8_ = b;
              auVar52._8_8_ = 0;
              auVar52._0_8_ = palVar22;
              auVar60 = vpunpcklqdq_avx(auVar47,auVar52);
              auVar53._8_8_ = 0;
              auVar53._0_8_ = b_00;
              auVar56._8_8_ = 0;
              auVar56._0_8_ = local_218;
              auVar61 = vpunpcklqdq_avx(auVar53,auVar56);
              auVar47 = ZEXT116(0) * auVar61 + ZEXT116(1) * auVar60;
              auVar52 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar61;
              auVar55._8_8_ = 0;
              auVar55._0_8_ = b_01;
              auVar57._8_8_ = 0;
              auVar57._0_8_ = b_02;
              auVar60 = vpunpcklqdq_avx(auVar55,auVar57);
              auVar58._8_8_ = 0;
              auVar58._0_8_ = b_03;
              auVar62._8_8_ = 0;
              auVar62._0_8_ = b_04;
              auVar61 = vpunpcklqdq_avx(auVar58,auVar62);
              auVar53 = ZEXT116(0) * auVar61 + ZEXT116(1) * auVar60;
              auVar55 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar61;
              auVar59._8_8_ = 0;
              auVar59._0_8_ = local_200;
              auVar63._8_8_ = 0;
              auVar63._0_8_ = local_1f0;
              auVar60 = vpunpcklqdq_avx(auVar59,auVar63);
              auVar64._8_8_ = 0;
              auVar64._0_8_ = local_208;
              auVar65._8_8_ = 0;
              auVar65._0_8_ = local_1f8;
              auVar61 = vpunpcklqdq_avx(auVar64,auVar65);
              auVar60 = ZEXT116(0) * auVar61 + ZEXT116(1) * auVar60;
              auVar61 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar61;
              auVar44._0_8_ = -(ulong)(auVar43._0_8_ == 0);
              auVar44._8_8_ = -(ulong)(auVar43._8_8_ == 0);
              auVar44._16_8_ = -(ulong)(auVar46._0_8_ == 0);
              auVar44._24_8_ = -(ulong)(auVar46._8_8_ == 0);
              auVar49._0_8_ = -(ulong)(auVar47._0_8_ == 0);
              auVar49._8_8_ = -(ulong)(auVar47._8_8_ == 0);
              auVar49._16_8_ = -(ulong)(auVar52._0_8_ == 0);
              auVar49._24_8_ = -(ulong)(auVar52._8_8_ == 0);
              auVar44 = vpackssdw_avx2(auVar44,auVar49);
              auVar49 = vpermq_avx2(auVar44,0xd8);
              auVar48._0_8_ = -(ulong)(auVar53._0_8_ == 0);
              auVar48._8_8_ = -(ulong)(auVar53._8_8_ == 0);
              auVar48._16_8_ = -(ulong)(auVar55._0_8_ == 0);
              auVar48._24_8_ = -(ulong)(auVar55._8_8_ == 0);
              auVar54._0_8_ = -(ulong)(auVar60._0_8_ == 0);
              auVar54._8_8_ = -(ulong)(auVar60._8_8_ == 0);
              auVar54._16_8_ = -(ulong)(auVar61._0_8_ == 0);
              auVar54._24_8_ = -(ulong)(auVar61._8_8_ == 0);
              auVar44 = vpackssdw_avx2(auVar48,auVar54);
              auVar44 = vpermq_avx2(auVar44,0xd8);
              auVar44 = vpackssdw_avx2(auVar49,auVar44);
              if ((((((((((((((((auVar44 >> 0xf & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                               (auVar44 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                              && (auVar44 >> 0x2f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && (auVar44 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                            && (auVar44 >> 0x4f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                           && (auVar44 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar44 >> 0x6f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar44 >> 0x7f,0) == '\0') &&
                        (auVar44 >> 0x8f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar44 >> 0x9f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar44 >> 0xaf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar44 >> 0xbf,0) == '\0') &&
                    (auVar44 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   (auVar44 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar44 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  -1 < auVar44[0x1f]) {
                local_210 = 0;
                alVar3[1]._4_4_ = in_stack_fffffffffffffdb4;
                alVar3._0_12_ = in_stack_fffffffffffffda8;
                alVar3[2] = (longlong)palVar21;
                alVar3[3] = (longlong)b_00;
                palVar39 = palVar21;
                parasail_memset___m256i(palVar20,alVar3,size);
                c[1]._4_4_ = in_stack_fffffffffffffdb4;
                c._0_12_ = in_stack_fffffffffffffda8;
                c[2] = (longlong)palVar39;
                c[3] = (longlong)b_00;
                parasail_memset___m256i(palVar21,c,size);
                c_00[1]._4_4_ = in_stack_fffffffffffffdb4;
                c_00._0_12_ = in_stack_fffffffffffffda8;
                c_00[2] = (longlong)palVar39;
                c_00[3] = (longlong)b_00;
                parasail_memset___m256i(b,c_00,size);
                c_01[1]._4_4_ = in_stack_fffffffffffffdb4;
                c_01._0_12_ = in_stack_fffffffffffffda8;
                c_01[2] = (longlong)palVar39;
                c_01[3] = (longlong)b_00;
                parasail_memset___m256i(b_00,c_01,size);
                c_02[1]._4_4_ = in_stack_fffffffffffffdb4;
                c_02._0_12_ = in_stack_fffffffffffffda8;
                c_02[2] = (longlong)palVar39;
                c_02[3] = (longlong)b_00;
                parasail_memset___m256i(b_01,c_02,size);
                c_03[1]._4_4_ = in_stack_fffffffffffffdb4;
                c_03._0_12_ = in_stack_fffffffffffffda8;
                c_03[2] = (longlong)palVar39;
                c_03[3] = (longlong)b_00;
                parasail_memset___m256i(b_02,c_03,size);
                c_04[1]._4_4_ = in_stack_fffffffffffffdb4;
                c_04._0_12_ = in_stack_fffffffffffffda8;
                c_04[2] = (longlong)palVar39;
                c_04[3] = (longlong)b_00;
                parasail_memset___m256i(b_03,c_04,size);
                c_05[1]._4_4_ = in_stack_fffffffffffffdb4;
                c_05._0_12_ = in_stack_fffffffffffffda8;
                c_05[2] = (longlong)palVar39;
                c_05[3] = (longlong)b_00;
                parasail_memset___m256i(b_04,c_05,size);
                uVar15 = (uint)size;
                uVar40 = uVar15 - 1;
                lVar33 = size * local_1d0;
                lVar1 = lVar33 * 4;
                lVar2 = lVar33 * 8;
                lVar16 = lVar33 * 0xc;
                lVar18 = lVar33 * 0x1c;
                lVar34 = lVar33 * 0x10;
                lVar17 = lVar33 * 0x14;
                lVar33 = lVar33 * 0x18;
                iVar75 = -0x40000000;
                lVar23 = 0;
                uVar35 = 0;
                auVar74 = ZEXT1664((undefined1  [16])0x0);
                auVar51 = ZEXT1664((undefined1  [16])0x0);
                auVar73 = ZEXT1664((undefined1  [16])0x0);
                do {
                  local_228 = b;
                  palVar39 = b_00;
                  palVar28 = palVar21;
                  palVar26 = palVar20;
                  local_178 = auVar74._0_32_;
                  auVar44 = auVar51._0_32_;
                  lVar38 = (long)(int)(ppVar8->mapper[(byte)s2[uVar35]] * uVar15) * 0x20;
                  bVar42 = (int)local_210 == (int)uVar35 + -2;
                  b = palVar22;
                  palVar21 = local_1f8;
                  b_00 = local_218;
                  if (bVar42) {
                    b = local_208;
                    local_208 = palVar22;
                    palVar21 = local_218;
                    b_00 = local_1f8;
                  }
                  local_1f8 = palVar21;
                  palVar20 = local_230;
                  palVar22 = local_1f0;
                  palVar21 = local_220;
                  if (bVar42) {
                    palVar20 = local_200;
                    local_200 = local_230;
                    palVar22 = local_220;
                    palVar21 = local_1f0;
                  }
                  local_1f0 = palVar22;
                  alVar3 = palVar39[uVar40];
                  auVar49 = vperm2i128_avx2((undefined1  [32])alVar3,(undefined1  [32])alVar3,0x28);
                  auVar66 = vpalignr_avx2((undefined1  [32])alVar3,auVar49,0xc);
                  alVar3 = local_228[uVar40];
                  auVar49 = vperm2i128_avx2((undefined1  [32])alVar3,(undefined1  [32])alVar3,0x28);
                  auVar54 = vpalignr_avx2((undefined1  [32])alVar3,auVar49,0xc);
                  alVar3 = palVar28[uVar40];
                  auVar49 = vperm2i128_avx2((undefined1  [32])alVar3,(undefined1  [32])alVar3,0x28);
                  auVar48 = vpalignr_avx2((undefined1  [32])alVar3,auVar49,0xc);
                  alVar3 = palVar26[uVar40];
                  auVar49 = vperm2i128_avx2((undefined1  [32])alVar3,(undefined1  [32])alVar3,0x28);
                  auVar49 = vpalignr_avx2((undefined1  [32])alVar3,auVar49,0xc);
                  auVar51 = ZEXT1664((undefined1  [16])0x0);
                  lVar41 = 0;
                  auVar69 = ZEXT3264(CONCAT428(1,CONCAT424(1,CONCAT420(1,CONCAT416(1,CONCAT412(1,
                                                  CONCAT48(1,0x100000001)))))));
                  auVar67 = ZEXT1664((undefined1  [16])0x0);
                  auVar72 = ZEXT1664((undefined1  [16])0x0);
                  lVar27 = lVar23;
                  do {
                    auVar4 = *(undefined1 (*) [32])((long)*b_01 + lVar41);
                    auVar5 = *(undefined1 (*) [32])((long)*b_02 + lVar41);
                    auVar50 = *(undefined1 (*) [32])((long)*b_03 + lVar41);
                    auVar45 = *(undefined1 (*) [32])((long)*b_04 + lVar41);
                    auVar49 = vpaddd_avx2(auVar49,*(undefined1 (*) [32])
                                                   ((long)pvVar7 + lVar41 + lVar38));
                    auVar49 = vpmaxsd_avx2(auVar49,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                    auVar13 = vpmaxsd_avx2(auVar49,auVar4);
                    auVar70 = auVar72._0_32_;
                    auVar14 = vpmaxsd_avx2(auVar13,auVar70);
                    *(undefined1 (*) [32])((long)*palVar20 + lVar41) = auVar14;
                    auVar11 = vpcmpeqd_avx2(auVar14,auVar49);
                    auVar71 = vpcmpgtd_avx2(auVar13,auVar70);
                    auVar49 = vblendvps_avx(auVar67._0_32_,auVar5,auVar71);
                    auVar48 = vpaddd_avx2(auVar48,*(undefined1 (*) [32])
                                                   ((long)pvVar9 + lVar41 + lVar38));
                    auVar49 = vblendvps_avx(auVar49,auVar48,auVar11);
                    auVar12 = vpcmpeqd_avx2(auVar14,ZEXT832(0) << 0x20);
                    auVar13 = vpandn_avx2(auVar12,auVar49);
                    *(undefined1 (*) [32])((long)*palVar21 + lVar41) = auVar13;
                    auVar49 = vblendvps_avx(auVar51._0_32_,auVar50,auVar71);
                    auVar48 = vpaddd_avx2(auVar54,*(undefined1 (*) [32])
                                                   ((long)pvVar10 + lVar41 + lVar38));
                    auVar48 = vblendvps_avx(auVar49,auVar48,auVar11);
                    auVar54 = vpandn_avx2(auVar12,auVar48);
                    *(undefined1 (*) [32])((long)*b + lVar41) = auVar54;
                    auVar68 = auVar69._0_32_;
                    auVar48 = vblendvps_avx(auVar68,auVar45,auVar71);
                    auVar49 = vpcmpeqd_avx2(auVar49,auVar49);
                    auVar49 = vpsubd_avx2(auVar66,auVar49);
                    auVar49 = vblendvps_avx(auVar48,auVar49,auVar11);
                    auVar66 = vpandn_avx2(auVar12,auVar49);
                    *(undefined1 (*) [32])((long)*b_00 + lVar41) = auVar66;
                    lVar29 = *(long *)((long)((result->field_4).trace)->trace_del_table + 8);
                    *(int *)(lVar29 + lVar27) = auVar13._0_4_;
                    lVar29 = lVar29 + lVar27;
                    *(int *)(lVar1 + lVar29) = auVar13._4_4_;
                    *(int *)(lVar2 + lVar29) = auVar13._8_4_;
                    *(int *)(lVar16 + lVar29) = auVar13._12_4_;
                    *(int *)(lVar34 + lVar29) = auVar13._16_4_;
                    *(int *)(lVar17 + lVar29) = auVar13._20_4_;
                    *(int *)(lVar33 + lVar29) = auVar13._24_4_;
                    *(int *)(lVar18 + lVar29) = auVar13._28_4_;
                    lVar29 = *(long *)((long)((result->field_4).trace)->trace_del_table + 0x10);
                    *(int *)(lVar29 + lVar27) = auVar54._0_4_;
                    lVar29 = lVar29 + lVar27;
                    *(int *)(lVar1 + lVar29) = auVar54._4_4_;
                    *(int *)(lVar2 + lVar29) = auVar54._8_4_;
                    *(int *)(lVar16 + lVar29) = auVar54._12_4_;
                    *(int *)(lVar34 + lVar29) = auVar54._16_4_;
                    *(int *)(lVar17 + lVar29) = auVar54._20_4_;
                    *(int *)(lVar33 + lVar29) = auVar54._24_4_;
                    *(int *)(lVar18 + lVar29) = auVar54._28_4_;
                    lVar29 = *(long *)((long)((result->field_4).trace)->trace_del_table + 0x18);
                    *(int *)(lVar29 + lVar27) = auVar66._0_4_;
                    lVar29 = lVar29 + lVar27;
                    *(int *)(lVar1 + lVar29) = auVar66._4_4_;
                    *(int *)(lVar2 + lVar29) = auVar66._8_4_;
                    *(int *)(lVar16 + lVar29) = auVar66._12_4_;
                    *(int *)(lVar34 + lVar29) = auVar66._16_4_;
                    *(int *)(lVar17 + lVar29) = auVar66._20_4_;
                    *(int *)(lVar33 + lVar29) = auVar66._24_4_;
                    *(int *)(lVar18 + lVar29) = auVar66._28_4_;
                    lVar29 = *((result->field_4).trace)->trace_del_table;
                    *(int *)(lVar29 + lVar27) = auVar14._0_4_;
                    lVar29 = lVar29 + lVar27;
                    *(int *)(lVar1 + lVar29) = auVar14._4_4_;
                    *(int *)(lVar2 + lVar29) = auVar14._8_4_;
                    *(int *)(lVar16 + lVar29) = auVar14._12_4_;
                    *(int *)(lVar34 + lVar29) = auVar14._16_4_;
                    *(int *)(lVar17 + lVar29) = auVar14._20_4_;
                    *(int *)(lVar33 + lVar29) = auVar14._24_4_;
                    *(int *)(lVar18 + lVar29) = auVar14._28_4_;
                    auVar11._4_4_ = open;
                    auVar11._0_4_ = open;
                    auVar11._8_4_ = open;
                    auVar11._12_4_ = open;
                    auVar11._16_4_ = open;
                    auVar11._20_4_ = open;
                    auVar11._24_4_ = open;
                    auVar11._28_4_ = open;
                    auVar11 = vpsubd_avx2(auVar14,auVar11);
                    auVar12._4_4_ = gap;
                    auVar12._0_4_ = gap;
                    auVar12._8_4_ = gap;
                    auVar12._12_4_ = gap;
                    auVar12._16_4_ = gap;
                    auVar12._20_4_ = gap;
                    auVar12._24_4_ = gap;
                    auVar12._28_4_ = gap;
                    auVar12 = vpsubd_avx2(auVar4,auVar12);
                    auVar48 = vpcmpgtd_avx2(auVar11,auVar12);
                    auVar49 = vblendvps_avx(auVar5,auVar13,auVar48);
                    auVar4 = vblendvps_avx(auVar50,auVar54,auVar48);
                    auVar5 = vpcmpeqd_avx2(auVar68,auVar68);
                    auVar50 = vpsubd_avx2(auVar45,auVar5);
                    auVar45 = vpsubd_avx2(auVar66,auVar5);
                    auVar48 = vblendvps_avx(auVar50,auVar45,auVar48);
                    auVar50 = vpmaxsd_avx2(auVar13,local_178);
                    auVar66 = vpmaxsd_avx2(auVar54,auVar66);
                    local_178 = vpmaxsd_avx2(auVar50,auVar66);
                    auVar66 = vpmaxsd_avx2(auVar11,auVar12);
                    *(undefined1 (*) [32])((long)*b_01 + lVar41) = auVar66;
                    *(undefined1 (*) [32])((long)*b_02 + lVar41) = auVar49;
                    *(undefined1 (*) [32])((long)*b_03 + lVar41) = auVar4;
                    *(undefined1 (*) [32])((long)*b_04 + lVar41) = auVar48;
                    auVar66._4_4_ = gap;
                    auVar66._0_4_ = gap;
                    auVar66._8_4_ = gap;
                    auVar66._12_4_ = gap;
                    auVar66._16_4_ = gap;
                    auVar66._20_4_ = gap;
                    auVar66._24_4_ = gap;
                    auVar66._28_4_ = gap;
                    auVar66 = vpsubd_avx2(auVar70,auVar66);
                    auVar48 = vpcmpgtd_avx2(auVar11,auVar66);
                    auVar49 = vblendvps_avx(auVar67._0_32_,auVar13,auVar48);
                    auVar67 = ZEXT3264(auVar49);
                    auVar49 = vblendvps_avx(auVar51._0_32_,auVar54,auVar48);
                    auVar51 = ZEXT3264(auVar49);
                    auVar49 = vpmaxsd_avx2(auVar14,auVar73._0_32_);
                    auVar73 = ZEXT3264(auVar49);
                    auVar49 = vpsubd_avx2(auVar68,auVar5);
                    auVar49 = vblendvps_avx(auVar49,auVar45,auVar48);
                    auVar69 = ZEXT3264(auVar49);
                    auVar49 = vpmaxsd_avx2(auVar11,auVar66);
                    auVar72 = ZEXT3264(auVar49);
                    auVar49 = *(undefined1 (*) [32])((long)*palVar26 + lVar41);
                    auVar48 = *(undefined1 (*) [32])((long)*palVar28 + lVar41);
                    auVar54 = *(undefined1 (*) [32])((long)*local_228 + lVar41);
                    auVar66 = *(undefined1 (*) [32])((long)*palVar39 + lVar41);
                    lVar41 = lVar41 + 0x20;
                    lVar27 = lVar27 + local_1d0 * 4;
                  } while (size << 5 != lVar41);
                  local_198 = 0;
                  auVar5._4_4_ = open;
                  auVar5._0_4_ = open;
                  auVar5._8_4_ = open;
                  auVar5._12_4_ = open;
                  auVar5._16_4_ = open;
                  auVar5._20_4_ = open;
                  auVar5._24_4_ = open;
                  auVar5._28_4_ = open;
                  auVar49 = vpcmpeqd_avx2(auVar4,auVar4);
                  auVar74 = ZEXT3264(local_178);
                  do {
                    auVar48 = vpermps_avx2(_DAT_00908cc0,auVar69._0_32_);
                    auVar48 = vblendps_avx(auVar48,ZEXT432(1),1);
                    auVar69 = ZEXT3264(auVar48);
                    auVar48 = vpermps_avx2(_DAT_00908cc0,auVar72._0_32_);
                    auVar48 = vblendps_avx(auVar48,ZEXT432((uint)-open),1);
                    auVar72 = ZEXT3264(auVar48);
                    alVar3 = palVar26[uVar40];
                    auVar48 = vperm2i128_avx2((undefined1  [32])alVar3,(undefined1  [32])alVar3,0x28
                                             );
                    auVar48 = vpalignr_avx2((undefined1  [32])alVar3,auVar48,0xc);
                    auVar66 = auVar67._0_32_;
                    auVar54 = vperm2i128_avx2(auVar66,auVar66,0x28);
                    auVar54 = vpalignr_avx2(auVar66,auVar54,0xc);
                    auVar67 = ZEXT3264(auVar54);
                    auVar66 = auVar51._0_32_;
                    auVar54 = vperm2i128_avx2(auVar66,auVar66,0x28);
                    auVar54 = vpalignr_avx2(auVar66,auVar54,0xc);
                    auVar51 = ZEXT3264(auVar54);
                    lVar41 = 0;
                    lVar27 = lVar23;
                    do {
                      auVar48 = vpaddd_avx2(auVar48,*(undefined1 (*) [32])
                                                     ((long)pvVar7 + lVar41 + lVar38));
                      auVar54 = vpmaxsd_avx2(auVar48,ZEXT832(0) << 0x20);
                      auVar48 = *(undefined1 (*) [32])((long)*palVar20 + lVar41);
                      auVar71 = auVar72._0_32_;
                      auVar4 = vpmaxsd_avx2(auVar48,auVar71);
                      *(undefined1 (*) [32])((long)*palVar20 + lVar41) = auVar4;
                      auVar54 = vpcmpeqd_avx2(auVar4,auVar54);
                      auVar48 = vpcmpgtd_avx2(auVar48,auVar71);
                      auVar66 = vpor_avx2(auVar54,auVar48);
                      auVar48 = vblendvps_avx(auVar67._0_32_,
                                              *(undefined1 (*) [32])((long)*palVar21 + lVar41),
                                              auVar66);
                      *(undefined1 (*) [32])((long)*palVar21 + lVar41) = auVar48;
                      auVar54 = vblendvps_avx(auVar51._0_32_,
                                              *(undefined1 (*) [32])((long)*b + lVar41),auVar66);
                      *(undefined1 (*) [32])((long)*b + lVar41) = auVar54;
                      auVar66 = vblendvps_avx(auVar69._0_32_,
                                              *(undefined1 (*) [32])((long)*b_00 + lVar41),auVar66);
                      *(undefined1 (*) [32])((long)*b_00 + lVar41) = auVar66;
                      lVar29 = *(long *)((long)((result->field_4).trace)->trace_del_table + 8);
                      *(int *)(lVar29 + lVar27) = auVar48._0_4_;
                      lVar29 = lVar29 + lVar27;
                      auVar60 = auVar48._0_16_;
                      uVar6 = vextractps_avx(auVar60,1);
                      *(undefined4 *)(lVar1 + lVar29) = uVar6;
                      uVar6 = vextractps_avx(auVar60,2);
                      *(undefined4 *)(lVar2 + lVar29) = uVar6;
                      uVar6 = vextractps_avx(auVar60,3);
                      *(undefined4 *)(lVar16 + lVar29) = uVar6;
                      auVar60 = auVar48._16_16_;
                      *(int *)(lVar34 + lVar29) = auVar48._16_4_;
                      uVar6 = vextractps_avx(auVar60,1);
                      *(undefined4 *)(lVar17 + lVar29) = uVar6;
                      uVar6 = vextractps_avx(auVar60,2);
                      *(undefined4 *)(lVar33 + lVar29) = uVar6;
                      uVar6 = vextractps_avx(auVar60,3);
                      *(undefined4 *)(lVar18 + lVar29) = uVar6;
                      lVar29 = *(long *)((long)((result->field_4).trace)->trace_del_table + 0x10);
                      *(int *)(lVar29 + lVar27) = auVar54._0_4_;
                      lVar29 = lVar29 + lVar27;
                      auVar60 = auVar54._0_16_;
                      uVar6 = vextractps_avx(auVar60,1);
                      *(undefined4 *)(lVar1 + lVar29) = uVar6;
                      uVar6 = vextractps_avx(auVar60,2);
                      *(undefined4 *)(lVar2 + lVar29) = uVar6;
                      uVar6 = vextractps_avx(auVar60,3);
                      *(undefined4 *)(lVar16 + lVar29) = uVar6;
                      auVar60 = auVar54._16_16_;
                      *(int *)(lVar34 + lVar29) = auVar54._16_4_;
                      uVar6 = vextractps_avx(auVar60,1);
                      *(undefined4 *)(lVar17 + lVar29) = uVar6;
                      uVar6 = vextractps_avx(auVar60,2);
                      *(undefined4 *)(lVar33 + lVar29) = uVar6;
                      uVar6 = vextractps_avx(auVar60,3);
                      *(undefined4 *)(lVar18 + lVar29) = uVar6;
                      lVar29 = *(long *)((long)((result->field_4).trace)->trace_del_table + 0x18);
                      *(int *)(lVar29 + lVar27) = auVar66._0_4_;
                      lVar29 = lVar29 + lVar27;
                      auVar60 = auVar66._0_16_;
                      uVar6 = vextractps_avx(auVar60,1);
                      *(undefined4 *)(lVar1 + lVar29) = uVar6;
                      uVar6 = vextractps_avx(auVar60,2);
                      *(undefined4 *)(lVar2 + lVar29) = uVar6;
                      uVar6 = vextractps_avx(auVar60,3);
                      *(undefined4 *)(lVar16 + lVar29) = uVar6;
                      auVar60 = auVar66._16_16_;
                      *(int *)(lVar34 + lVar29) = auVar66._16_4_;
                      uVar6 = vextractps_avx(auVar60,1);
                      *(undefined4 *)(lVar17 + lVar29) = uVar6;
                      uVar6 = vextractps_avx(auVar60,2);
                      *(undefined4 *)(lVar33 + lVar29) = uVar6;
                      uVar6 = vextractps_avx(auVar60,3);
                      *(undefined4 *)(lVar18 + lVar29) = uVar6;
                      lVar29 = *((result->field_4).trace)->trace_del_table;
                      *(int *)(lVar29 + lVar27) = auVar4._0_4_;
                      lVar29 = lVar29 + lVar27;
                      *(int *)(lVar1 + lVar29) = auVar4._4_4_;
                      *(int *)(lVar2 + lVar29) = auVar4._8_4_;
                      *(int *)(lVar16 + lVar29) = auVar4._12_4_;
                      *(int *)(lVar34 + lVar29) = auVar4._16_4_;
                      *(int *)(lVar17 + lVar29) = auVar4._20_4_;
                      *(int *)(lVar33 + lVar29) = auVar4._24_4_;
                      *(int *)(lVar18 + lVar29) = auVar4._28_4_;
                      auVar50 = vpmaxsd_avx2(auVar74._0_32_,auVar48);
                      auVar45 = vpmaxsd_avx2(auVar54,auVar66);
                      auVar13 = vpmaxsd_avx2(auVar50,auVar45);
                      auVar74 = ZEXT3264(auVar13);
                      auVar11 = vpmaxsd_avx2(auVar4,auVar73._0_32_);
                      auVar73 = ZEXT3264(auVar11);
                      auVar12 = vpsubd_avx2(auVar4,auVar5);
                      auVar4._4_4_ = gap;
                      auVar4._0_4_ = gap;
                      auVar4._8_4_ = gap;
                      auVar4._12_4_ = gap;
                      auVar4._16_4_ = gap;
                      auVar4._20_4_ = gap;
                      auVar4._24_4_ = gap;
                      auVar4._28_4_ = gap;
                      auVar71 = vpsubd_avx2(auVar71,auVar4);
                      auVar72 = ZEXT3264(auVar71);
                      auVar50 = vpcmpgtd_avx2(auVar71,auVar12);
                      auVar4 = vpcmpeqd_avx2(auVar71,auVar12);
                      auVar45 = vpcmpgtd_avx2(auVar71,ZEXT832(0) << 0x20);
                      auVar4 = vpand_avx2(auVar4,auVar45);
                      auVar4 = vpor_avx2(auVar4,auVar50);
                      if ((((((((auVar4 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                               (auVar4 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                              (auVar4 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                             SUB321(auVar4 >> 0x7f,0) == '\0') &&
                            (auVar4 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar4 >> 0xbf,0) == '\0') &&
                          (auVar4 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar4[0x1f]) goto LAB_007f649e;
                      auVar4 = vpcmpgtd_avx2(auVar12,auVar71);
                      auVar48 = vblendvps_avx(auVar67._0_32_,auVar48,auVar4);
                      auVar67 = ZEXT3264(auVar48);
                      auVar48 = vblendvps_avx(auVar51._0_32_,auVar54,auVar4);
                      auVar51 = ZEXT3264(auVar48);
                      auVar48 = vblendvps_avx(auVar69._0_32_,auVar66,auVar4);
                      auVar48 = vpsubd_avx2(auVar48,auVar49);
                      auVar69 = ZEXT3264(auVar48);
                      auVar48 = *(undefined1 (*) [32])((long)*palVar26 + lVar41);
                      lVar41 = lVar41 + 0x20;
                      lVar27 = lVar27 + local_1d0 * 4;
                    } while (size << 5 != lVar41);
                    local_198 = local_198 + 1;
                  } while (local_198 != 8);
LAB_007f649e:
                  auVar49 = vpcmpgtd_avx2(auVar11,auVar44);
                  local_230 = palVar26;
                  local_220 = palVar28;
                  if ((((((((auVar49 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar49 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar49 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar49 >> 0x7f,0) != '\0') ||
                        (auVar49 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar49 >> 0xbf,0) != '\0') ||
                      (auVar49 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar49[0x1f] < '\0') {
                    auVar44 = vpermq_avx2(auVar11,0x44);
                    auVar44 = vpmaxsd_avx2(auVar11,auVar44);
                    auVar49 = vpslldq_avx2(auVar44,8);
                    auVar44 = vpmaxsd_avx2(auVar44,auVar49);
                    auVar49 = vpslldq_avx2(auVar44,4);
                    auVar44 = vpmaxsd_avx2(auVar44,auVar49);
                    iVar75 = auVar44._28_4_;
                    if (0x7ffffffe - iVar24 < iVar75) {
                      *(byte *)&result->flag = (byte)result->flag | 0x40;
                      local_1d0 = uVar35;
                      break;
                    }
                    auVar50._8_4_ = 7;
                    auVar50._0_8_ = 0x700000007;
                    auVar50._12_4_ = 7;
                    auVar50._16_4_ = 7;
                    auVar50._20_4_ = 7;
                    auVar50._24_4_ = 7;
                    auVar50._28_4_ = 7;
                    auVar44 = vpermd_avx2(auVar50,auVar44);
                    local_210 = uVar35 & 0xffffffff;
                  }
                  auVar51 = ZEXT3264(auVar44);
                  uVar35 = uVar35 + 1;
                  lVar23 = lVar23 + 4;
                  palVar22 = local_228;
                  local_218 = palVar39;
                } while (uVar35 != local_1d0);
                if ((iVar75 == 0x7fffffff) ||
                   (auVar45._8_4_ = 0x7fffffff, auVar45._0_8_ = 0x7fffffff7fffffff,
                   auVar45._12_4_ = 0x7fffffff, auVar45._16_4_ = 0x7fffffff,
                   auVar45._20_4_ = 0x7fffffff, auVar45._24_4_ = 0x7fffffff,
                   auVar45._28_4_ = 0x7fffffff, auVar44 = vpcmpeqd_avx2(auVar13,auVar45),
                   (((((((auVar44 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (auVar44 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar44 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(auVar44 >> 0x7f,0) != '\0') ||
                     (auVar44 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(auVar44 >> 0xbf,0) != '\0') ||
                   (auVar44 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   auVar44[0x1f] < '\0')) {
                  *(byte *)&result->flag = (byte)result->flag | 0x40;
                }
                iVar19 = parasail_result_is_saturated(result);
                iVar24 = 0;
                local_158 = SUB84(local_1f0,0);
                uStack_154 = (undefined4)((ulong)local_1f0 >> 0x20);
                palVar22 = palVar20;
                palVar30 = local_1f8;
                palVar36 = local_228;
                local_178._0_8_ = local_208;
                if (iVar19 == 0) {
                  if ((int)local_210 == (int)local_1d0 + -1) {
                    local_158 = SUB84(palVar21,0);
                    uStack_154 = (undefined4)((ulong)palVar21 >> 0x20);
                    palVar21 = local_1f0;
                    palVar22 = local_200;
                    palVar30 = b_00;
                    b_00 = local_1f8;
                    local_200 = palVar20;
                    palVar20 = local_208;
                    local_178._0_8_ = b;
                  }
                  else {
                    palVar20 = b;
                    if ((int)local_210 == (int)local_1d0 + -2) {
                      local_178._0_8_ = local_228;
                      local_158 = SUB84(palVar28,0);
                      uStack_154 = (undefined4)((ulong)palVar28 >> 0x20);
                      local_230 = local_200;
                      palVar30 = palVar39;
                      local_200 = palVar26;
                      palVar36 = local_208;
                      palVar39 = local_1f8;
                      local_220 = local_1f0;
                    }
                  }
                  local_228 = palVar20;
                  if ((uVar31 & 0x7ffffff8) == 0) {
                    iVar24 = -0x40000000;
                    iVar25 = -0x40000000;
                    iVar19 = -0x40000000;
                  }
                  else {
                    iVar19 = -0x40000000;
                    uVar31 = 0;
                    iVar25 = -0x40000000;
                    iVar24 = -0x40000000;
                    do {
                      if ((*(int *)((long)*local_200 + uVar31 * 4) == iVar75) &&
                         (uVar32 = ((uint)uVar31 & 7) * uVar15 + ((uint)(uVar31 >> 3) & 0x1fffffff),
                         (int)uVar32 < (int)uVar37)) {
                        iVar19 = *(int *)(CONCAT44(uStack_154,local_158) + uVar31 * 4);
                        iVar24 = *(int *)((long)(longlong *)local_178._0_8_ + uVar31 * 4);
                        iVar25 = *(int *)((long)*palVar30 + uVar31 * 4);
                        uVar37 = (ulong)uVar32;
                      }
                      uVar32 = (uint)uVar37;
                      uVar31 = uVar31 + 1;
                    } while ((uVar15 & 0xfffffff) << 3 != (int)uVar31);
                  }
                }
                else {
                  iVar25 = 0;
                  iVar19 = 0;
                  iVar75 = 0;
                  local_210._0_4_ = 0;
                  uVar32 = 0;
                  local_228 = b;
                }
                result->score = iVar75;
                result->end_query = uVar32;
                result->end_ref = (int)local_210;
                ((result->field_4).stats)->matches = iVar19;
                ((result->field_4).stats)->similar = iVar24;
                ((result->field_4).stats)->length = iVar25;
                parasail_free(palVar30);
                parasail_free((void *)local_178._0_8_);
                parasail_free((void *)CONCAT44(uStack_154,local_158));
                parasail_free(local_200);
                parasail_free(b_04);
                parasail_free(b_03);
                parasail_free(b_02);
                parasail_free(b_01);
                parasail_free(palVar39);
                parasail_free(b_00);
                parasail_free(palVar36);
                parasail_free(local_228);
                parasail_free(local_220);
                parasail_free(palVar21);
                parasail_free(local_230);
                parasail_free(palVar22);
                return result;
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

STATIC parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m256i* restrict vProfile = NULL;
    __m256i* restrict vProfileM = NULL;
    __m256i* restrict vProfileS = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvHMStore = NULL;
    __m256i* restrict pvHMLoad = NULL;
    __m256i* restrict pvHSStore = NULL;
    __m256i* restrict pvHSLoad = NULL;
    __m256i* restrict pvHLStore = NULL;
    __m256i* restrict pvHLLoad = NULL;
    __m256i* restrict pvE = NULL;
    __m256i* restrict pvEM = NULL;
    __m256i* restrict pvES = NULL;
    __m256i* restrict pvEL = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvHMMax = NULL;
    __m256i* restrict pvHSMax = NULL;
    __m256i* restrict pvHLMax = NULL;
    __m256i vGapO;
    __m256i vGapE;
    __m256i vZero;
    __m256i vOne;
    int32_t score = 0;
    int32_t matches = 0;
    int32_t similar = 0;
    int32_t length = 0;
    __m256i vMaxH;
    __m256i vMaxHUnit;
    __m256i vSaturationCheckMax;
    __m256i vPosLimit;
    int32_t maxp = 0;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile  = (__m256i*)profile->profile32.score;
    vProfileM = (__m256i*)profile->profile32.matches;
    vProfileS = (__m256i*)profile->profile32.similar;
    vGapO = _mm256_set1_epi32(open);
    vGapE = _mm256_set1_epi32(gap);
    vZero = _mm256_setzero_si256();
    vOne = _mm256_set1_epi32(1);
    score = NEG_INF;
    matches = NEG_INF;
    similar = NEG_INF;
    length = NEG_INF;
    vMaxH = vZero;
    vMaxHUnit = vZero;
    vSaturationCheckMax = vZero;
    vPosLimit = _mm256_set1_epi32(INT32_MAX);
    maxp = INT32_MAX - (int32_t)(matrix->max+1);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore  = parasail_memalign___m256i(32, segLen);
    pvHLoad   = parasail_memalign___m256i(32, segLen);
    pvHMStore = parasail_memalign___m256i(32, segLen);
    pvHMLoad  = parasail_memalign___m256i(32, segLen);
    pvHSStore = parasail_memalign___m256i(32, segLen);
    pvHSLoad  = parasail_memalign___m256i(32, segLen);
    pvHLStore = parasail_memalign___m256i(32, segLen);
    pvHLLoad  = parasail_memalign___m256i(32, segLen);
    pvE       = parasail_memalign___m256i(32, segLen);
    pvEM      = parasail_memalign___m256i(32, segLen);
    pvES      = parasail_memalign___m256i(32, segLen);
    pvEL      = parasail_memalign___m256i(32, segLen);
    pvHMax    = parasail_memalign___m256i(32, segLen);
    pvHMMax   = parasail_memalign___m256i(32, segLen);
    pvHSMax   = parasail_memalign___m256i(32, segLen);
    pvHLMax   = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMStore) return NULL;
    if (!pvHMLoad) return NULL;
    if (!pvHSStore) return NULL;
    if (!pvHSLoad) return NULL;
    if (!pvHLStore) return NULL;
    if (!pvHLLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;

    parasail_memset___m256i(pvHStore, vZero, segLen);
    parasail_memset___m256i(pvHMStore, vZero, segLen);
    parasail_memset___m256i(pvHSStore, vZero, segLen);
    parasail_memset___m256i(pvHLStore, vZero, segLen);
    parasail_memset___m256i(pvE, _mm256_set1_epi32(-open), segLen);
    parasail_memset___m256i(pvEM, vZero, segLen);
    parasail_memset___m256i(pvES, vZero, segLen);
    parasail_memset___m256i(pvEL, vOne, segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vEF_opn;
        __m256i vE;
        __m256i vE_ext;
        __m256i vEM;
        __m256i vES;
        __m256i vEL;
        __m256i vF;
        __m256i vF_ext;
        __m256i vFM;
        __m256i vFS;
        __m256i vFL;
        __m256i vH;
        __m256i vH_dag;
        __m256i vHM;
        __m256i vHS;
        __m256i vHL;
        const __m256i* vP = NULL;
        const __m256i* vPM = NULL;
        const __m256i* vPS = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop. */
        vF = vZero;
        vFM = vZero;
        vFS = vZero;
        vFL = vOne;

        /* load final segment of pvHStore and shift left by 4 bytes */
        vH = _mm256_load_si256(&pvHStore[segLen - 1]);
        vHM = _mm256_load_si256(&pvHMStore[segLen - 1]);
        vHS = _mm256_load_si256(&pvHSStore[segLen - 1]);
        vHL = _mm256_load_si256(&pvHLStore[segLen - 1]);
        vH = _mm256_slli_si256_rpl(vH, 4);
        vHM = _mm256_slli_si256_rpl(vHM, 4);
        vHS = _mm256_slli_si256_rpl(vHS, 4);
        vHL = _mm256_slli_si256_rpl(vHL, 4);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPM = vProfileM + matrix->mapper[(unsigned char)s2[j]] * segLen;
        vPS = vProfileS + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            SWAP3(pvHMax,  pvHLoad,  pvHStore)
            SWAP3(pvHMMax, pvHMLoad, pvHMStore)
            SWAP3(pvHSMax, pvHSLoad, pvHSStore)
            SWAP3(pvHLMax, pvHLLoad, pvHLStore)
        }
        else {
            /* Swap the 2 H buffers. */
            SWAP(pvHLoad,  pvHStore)
            SWAP(pvHMLoad, pvHMStore)
            SWAP(pvHSLoad, pvHSStore)
            SWAP(pvHLLoad, pvHLStore)
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            __m256i cond_zero;
            __m256i case1;
            __m256i case2;

            vE = _mm256_load_si256(pvE+ i);
            vEM = _mm256_load_si256(pvEM+ i);
            vES = _mm256_load_si256(pvES+ i);
            vEL = _mm256_load_si256(pvEL+ i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm256_add_epi32(vH, _mm256_load_si256(vP + i));
            vH_dag = _mm256_max_epi32(vH_dag, vZero);
            vH = _mm256_max_epi32(vH_dag, vE);
            vH = _mm256_max_epi32(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
            cond_zero = _mm256_cmpeq_epi32(vH, vZero);

            case1 = _mm256_cmpeq_epi32(vH, vH_dag);
            case2 = _mm256_cmpeq_epi32(vH, vF);

            /* calculate vM */
            vHM = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEM, vFM, case2),
                    _mm256_add_epi32(vHM, _mm256_load_si256(vPM + i)), case1);
            vHM = _mm256_andnot_si256(cond_zero, vHM);
            _mm256_store_si256(pvHMStore + i, vHM);

            /* calculate vS */
            vHS = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vES, vFS, case2),
                    _mm256_add_epi32(vHS, _mm256_load_si256(vPS + i)), case1);
            vHS = _mm256_andnot_si256(cond_zero, vHS);
            _mm256_store_si256(pvHSStore + i, vHS);

            /* calculate vL */
            vHL = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEL, vFL, case2),
                    _mm256_add_epi32(vHL, vOne), case1);
            vHL = _mm256_andnot_si256(cond_zero, vHL);
            _mm256_store_si256(pvHLStore + i, vHL);

            vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
            arr_store(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm256_max_epi32(vH, vMaxH);
            vEF_opn = _mm256_sub_epi32(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm256_sub_epi32(vE, vGapE);
            vE = _mm256_max_epi32(vEF_opn, vE_ext);
            case1 = _mm256_cmpgt_epi32(vEF_opn, vE_ext);
            vEM = _mm256_blendv_epi8(vEM, vHM, case1);
            vES = _mm256_blendv_epi8(vES, vHS, case1);
            vEL = _mm256_blendv_epi8(
                    _mm256_add_epi32(vEL, vOne),
                    _mm256_add_epi32(vHL, vOne),
                    case1);
            _mm256_store_si256(pvE + i, vE);
            _mm256_store_si256(pvEM + i, vEM);
            _mm256_store_si256(pvES + i, vES);
            _mm256_store_si256(pvEL + i, vEL);

            /* Update vF value. */
            vF_ext = _mm256_sub_epi32(vF, vGapE);
            vF = _mm256_max_epi32(vEF_opn, vF_ext);
            case1 = _mm256_cmpgt_epi32(vEF_opn, vF_ext);
            vFM = _mm256_blendv_epi8(vFM, vHM, case1);
            vFS = _mm256_blendv_epi8(vFS, vHS, case1);
            vFL = _mm256_blendv_epi8(
                    _mm256_add_epi32(vFL, vOne),
                    _mm256_add_epi32(vHL, vOne),
                    case1);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
            vHM = _mm256_load_si256(pvHMLoad + i);
            vHS = _mm256_load_si256(pvHSLoad + i);
            vHL = _mm256_load_si256(pvHLLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            __m256i vHp = _mm256_load_si256(&pvHLoad[segLen - 1]);
            vHp = _mm256_slli_si256_rpl(vHp, 4);
            vF = _mm256_slli_si256_rpl(vF, 4);
            vF = _mm256_insert_epi32_rpl(vF, -open, 0);
            vFM = _mm256_slli_si256_rpl(vFM, 4);
            vFS = _mm256_slli_si256_rpl(vFS, 4);
            vFL = _mm256_slli_si256_rpl(vFL, 4);
            vFL = _mm256_insert_epi32_rpl(vFL, 1, 0);
            for (i=0; i<segLen; ++i) {
                __m256i case1;
                __m256i case2;
                __m256i cond;

                vHp = _mm256_add_epi32(vHp, _mm256_load_si256(vP + i));
                vHp = _mm256_max_epi32(vHp, vZero);
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi32(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
                case1 = _mm256_cmpeq_epi32(vH, vHp);
                case2 = _mm256_cmpeq_epi32(vH, vF);
                cond = _mm256_andnot_si256(case1, case2);

                /* calculate vM */
                vHM = _mm256_load_si256(pvHMStore + i);
                vHM = _mm256_blendv_epi8(vHM, vFM, cond);
                _mm256_store_si256(pvHMStore + i, vHM);

                /* calculate vS */
                vHS = _mm256_load_si256(pvHSStore + i);
                vHS = _mm256_blendv_epi8(vHS, vFS, cond);
                _mm256_store_si256(pvHSStore + i, vHS);

                /* calculate vL */
                vHL = _mm256_load_si256(pvHLStore + i);
                vHL = _mm256_blendv_epi8(vHL, vFL, cond);
                _mm256_store_si256(pvHLStore + i, vHL);

                vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vHM);
                vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vHS);
                vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
                arr_store(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
                arr_store(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
                arr_store(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
                arr_store(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vMaxH = _mm256_max_epi32(vH, vMaxH);
                /* Update vF value. */
                vEF_opn = _mm256_sub_epi32(vH, vGapO);
                vF_ext = _mm256_sub_epi32(vF, vGapE);
                if (! _mm256_movemask_epi8(
                            _mm256_or_si256(
                                _mm256_cmpgt_epi32(vF_ext, vEF_opn),
                                _mm256_and_si256(
                                    _mm256_cmpeq_epi32(vF_ext, vEF_opn),
                                    _mm256_cmpgt_epi32(vF_ext, vZero)))))
                    goto end;
                /*vF = _mm256_max_epi32(vEF_opn, vF_ext);*/
                vF = vF_ext;
                cond = _mm256_cmpgt_epi32(vEF_opn, vF_ext);
                vFM = _mm256_blendv_epi8(vFM, vHM, cond);
                vFS = _mm256_blendv_epi8(vFS, vHS, cond);
                vFL = _mm256_blendv_epi8(
                        _mm256_add_epi32(vFL, vOne),
                        _mm256_add_epi32(vHL, vOne),
                        cond);
                vHp = _mm256_load_si256(pvHLoad + i);
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvHStore + offset);
            vHM = _mm256_load_si256(pvHMStore + offset);
            vHS = _mm256_load_si256(pvHSStore + offset);
            vHL = _mm256_load_si256(pvHLStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 4);
                vHM = _mm256_slli_si256_rpl(vHM, 4);
                vHS = _mm256_slli_si256_rpl(vHS, 4);
                vHL = _mm256_slli_si256_rpl(vHL, 4);
            }
            result->stats->rowcols->score_row[j] = (int32_t) _mm256_extract_epi32_rpl (vH, 7);
            result->stats->rowcols->matches_row[j] = (int32_t) _mm256_extract_epi32_rpl (vHM, 7);
            result->stats->rowcols->similar_row[j] = (int32_t) _mm256_extract_epi32_rpl (vHS, 7);
            result->stats->rowcols->length_row[j] = (int32_t) _mm256_extract_epi32_rpl (vHL, 7);
        }
#endif

        {
            __m256i vCompare = _mm256_cmpgt_epi32(vMaxH, vMaxHUnit);
            if (_mm256_movemask_epi8(vCompare)) {
                score = _mm256_hmax_epi32_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm256_set1_epi32(score);
                end_ref = j;
            }
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        __m256i vHM = _mm256_load_si256(pvHMStore+i);
        __m256i vHS = _mm256_load_si256(pvHSStore+i);
        __m256i vHL = _mm256_load_si256(pvHLStore+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    if (score == INT32_MAX
            || _mm256_movemask_epi8(_mm256_cmpeq_epi32(vSaturationCheckMax,vPosLimit))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = 0;
        end_query = 0;
        end_ref = 0;
        matches = 0;
        similar = 0;
        length = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            SWAP(pvHMax,  pvHStore)
            SWAP(pvHMMax, pvHMStore)
            SWAP(pvHSMax, pvHSStore)
            SWAP(pvHLMax, pvHLStore)
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            SWAP(pvHMax,  pvHLoad)
            SWAP(pvHMMax, pvHMLoad)
            SWAP(pvHSMax, pvHSLoad)
            SWAP(pvHLMax, pvHLLoad)
        }
        /* Trace the alignment ending position on read. */
        {
            int32_t *t = (int32_t*)pvHMax;
            int32_t *m = (int32_t*)pvHMMax;
            int32_t *s = (int32_t*)pvHSMax;
            int32_t *l = (int32_t*)pvHLMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len;
            for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                        matches = *m;
                        similar = *s;
                        length = *l;
                    }
                }
            }
        }
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);
    parasail_free(pvHLLoad);
    parasail_free(pvHLStore);
    parasail_free(pvHSLoad);
    parasail_free(pvHSStore);
    parasail_free(pvHMLoad);
    parasail_free(pvHMStore);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}